

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

void __thiscall
Js::RecyclableObjectWalker::InsertItem
          (RecyclableObjectWalker *this,PropertyId propertyId,bool isConst,bool isUnscoped,
          Var itemObj,RecyclableMethodsGroupWalker **ppMethodsGroupWalker,bool shouldPinProperty)

{
  Type TVar1;
  code *pcVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  PropertyRecord *propertyRecord;
  DebugContext *pDVar8;
  RecyclableObject *this_00;
  DebuggerPropertyDisplayInfo *this_01;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  RecyclableMethodsGroupWalker *this_02;
  DebuggerPropertyDisplayInfo *local_48;
  DebuggerPropertyDisplayInfo *info;
  ArenaAllocator *local_38;
  
  info._0_4_ = (uint)CONCAT71(in_register_00000009,isUnscoped);
  info._4_4_ = (uint)CONCAT71(in_register_00000011,isConst);
  if (propertyId == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xa9b,"(propertyId)","propertyId");
    if (!bVar5) goto LAB_007ed5c8;
    *puVar7 = 0;
  }
  if (ppMethodsGroupWalker == (RecyclableMethodsGroupWalker **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xa9c,"(ppMethodsGroupWalker)","ppMethodsGroupWalker");
    if (!bVar5) goto LAB_007ed5c8;
    *puVar7 = 0;
  }
  if (itemObj == (Var)0x0) {
    itemObj = (((this->scriptContext->super_ScriptContextBase).javascriptLibrary)->
              super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  if ((shouldPinProperty) &&
     (propertyRecord = ScriptContext::GetPropertyName(this->scriptContext,propertyId),
     propertyRecord != (PropertyRecord *)0x0)) {
    pDVar8 = ScriptContext::GetDebugContext(this->scriptContext);
    ProbeContainer::PinPropertyRecord(pDVar8->diagProbesContainer,propertyRecord);
  }
  local_38 = GetArenaFromContext(this->scriptContext);
  if ((RecyclableObject *)itemObj == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar5) goto LAB_007ed5c8;
    *puVar7 = 0;
  }
  bVar5 = TaggedInt::Is(itemObj);
  if ((ulong)itemObj >> 0x32 == 0 && !bVar5) {
    this_00 = UnsafeVarTo<Js::RecyclableObject>(itemObj);
    if (this_00 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar5) goto LAB_007ed5c8;
      *puVar7 = 0;
    }
    TVar1 = ((this_00->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      if (TVar1 == TypeIds_Function) {
        if ((this->scriptContext->threadContext->debugManager->localsDisplayFlags & 1) == 0) {
          EnsureFakeGroupObjectWalkerList(this);
          this_02 = *ppMethodsGroupWalker;
          if (this_02 == (RecyclableMethodsGroupWalker *)0x0) {
            this_01 = (DebuggerPropertyDisplayInfo *)
                      new<Memory::ArenaAllocator>(0x38,local_38,0x35916e);
            RecyclableMethodsGroupWalker::RecyclableMethodsGroupWalker
                      ((RecyclableMethodsGroupWalker *)this_01,this->scriptContext,this->instance);
            *ppMethodsGroupWalker = (RecyclableMethodsGroupWalker *)this_01;
            local_48 = this_01;
            JsUtil::
            List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::Add(this->fakeGroupObjectWalkerList,(IDiagObjectModelWalkerBase **)&local_48);
            this_02 = *ppMethodsGroupWalker;
          }
          RecyclableMethodsGroupWalker::AddItem(this_02,propertyId,itemObj);
          return;
        }
        local_48 = (DebuggerPropertyDisplayInfo *)
                   new<Memory::ArenaAllocator>(0x18,local_38,0x35916e);
        local_48->propId = propertyId;
        local_48->aVar = itemObj;
        local_48->flags = 1;
        goto LAB_007ed584;
      }
    }
    else {
      BVar6 = RecyclableObject::IsExternal(this_00);
      if (BVar6 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar5) {
LAB_007ed5c8:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
      }
    }
  }
  uVar4 = (uint)info & 0xff;
  uVar3 = info._4_4_ & 0xff;
  local_48 = (DebuggerPropertyDisplayInfo *)new<Memory::ArenaAllocator>(0x18,local_38,0x35916e);
  local_48->propId = propertyId;
  local_48->aVar = itemObj;
  local_48->flags = uVar3 + uVar4 * 4;
LAB_007ed584:
  JsUtil::
  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::Add(this->pMembersList,&local_48);
  return;
}

Assistant:

void RecyclableObjectWalker::InsertItem(
        PropertyId propertyId,
        bool isConst,
        bool isUnscoped,
        Var itemObj,
        Js:: RecyclableMethodsGroupWalker **ppMethodsGroupWalker,
        bool shouldPinProperty /* = false*/)
    {
        Assert(propertyId);
        Assert(ppMethodsGroupWalker);

        if (itemObj == nullptr)
        {
            itemObj = scriptContext->GetLibrary()->GetUndefined();
        }

        if (shouldPinProperty)
        {
            const Js::PropertyRecord * propertyRecord = scriptContext->GetPropertyName(propertyId);
            if (propertyRecord)
            {
                // Pin this record so that it will not go away till we are done with this break.
                scriptContext->GetDebugContext()->GetProbeContainer()->PinPropertyRecord(propertyRecord);
            }
        }

        ArenaAllocator *arena = GetArenaFromContext(scriptContext);

        if (JavascriptOperators::GetTypeId(itemObj) == TypeIds_Function)
        {
            if (scriptContext->GetThreadContext()->GetDebugManager()->IsLocalsDisplayFlagsSet(Js::DebugManager::LocalsDisplayFlags::LocalsDisplayFlags_NoGroupMethods))
            {
                DebuggerPropertyDisplayInfo *info = Anew(arena, DebuggerPropertyDisplayInfo, propertyId, itemObj, DebuggerPropertyDisplayInfoFlags_Const);
                pMembersList->Add(info);
            }
            else
            {
                EnsureFakeGroupObjectWalkerList();

                if (*ppMethodsGroupWalker == nullptr)
                {
                    *ppMethodsGroupWalker = Anew(arena, RecyclableMethodsGroupWalker, scriptContext, instance);
                    fakeGroupObjectWalkerList->Add(*ppMethodsGroupWalker);
                }

                (*ppMethodsGroupWalker)->AddItem(propertyId, itemObj);
            }
        }
        else
        {
            DWORD flags = DebuggerPropertyDisplayInfoFlags_None;
            flags |= isConst ? DebuggerPropertyDisplayInfoFlags_Const : 0;
            flags |= isUnscoped ? DebuggerPropertyDisplayInfoFlags_Unscope : 0;

            DebuggerPropertyDisplayInfo *info = Anew(arena, DebuggerPropertyDisplayInfo, propertyId, itemObj, flags);

            pMembersList->Add(info);
        }
    }